

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::UniformType::streamArrayStr
          (UniformType *this,ostringstream *_str,int arrayElem)

{
  pointer piVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  size_t segment_1;
  size_t segment;
  ulong uVar5;
  
  if (this->isArray == true) {
    if (arrayElem < 0) {
      for (uVar5 = 0;
          uVar5 < (ulong)((long)(this->arraySizesSegmented).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)(this->arraySizesSegmented).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
        poVar3 = std::operator<<(&_str->super_basic_ostream<char,_std::char_traits<char>_>,"[");
        poVar3 = (ostream *)
                 std::ostream::operator<<
                           (poVar3,(this->arraySizesSegmented).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar5]);
        std::operator<<(poVar3,"]");
      }
    }
    else {
      iVar2 = this->arraySize;
      for (uVar5 = 0;
          piVar1 = (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_start,
          uVar5 < (ulong)((long)(this->arraySizesSegmented).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
          uVar5 = uVar5 + 1) {
        iVar2 = iVar2 / piVar1[uVar5];
        poVar3 = std::operator<<(&_str->super_basic_ostream<char,_std::char_traits<char>_>,"[");
        iVar4 = arrayElem / iVar2;
        arrayElem = arrayElem % iVar2;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
        std::operator<<(poVar3,"]");
      }
    }
  }
  return;
}

Assistant:

void streamArrayStr(std::ostringstream& _str, int arrayElem = -1) const
	{
		if (!isArray)
		{
			return;
		}
		if (arrayElem < 0)
		{
			for (size_t segment = 0; segment < arraySizesSegmented.size(); segment++)
			{
				_str << "[" << arraySizesSegmented[segment] << "]";
			}
		}
		else
		{
			int tailSize = arraySize;
			for (size_t segment = 0; segment < arraySizesSegmented.size(); segment++)
			{
				tailSize /= arraySizesSegmented[segment];
				_str << "[" << arrayElem / tailSize << "]";
				arrayElem %= tailSize;
			}
		}
	}